

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::DtlsSession::Read(Error *__return_storage_ptr__,DtlsSession *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  uint aMbedtlsError;
  DtlsSession *pDVar4;
  undefined8 uVar5;
  ByteArray *aBytes;
  pointer puVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar8;
  bool bVar9;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  writer write;
  uint8_t buf [1024];
  allocator_type local_519;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  Error *local_510;
  uint local_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  undefined1 *local_4d8;
  char local_4d0 [8];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [32];
  undefined1 local_498 [8];
  _Alloc_hider local_490;
  pointer local_488;
  undefined1 local_480 [24];
  code *local_468;
  code *pcStack_460;
  code *local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  uchar local_438 [1032];
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (this->mState == kConnected) {
    aMbedtlsError = mbedtls_ssl_read(&this->mSsl,local_438,0x400);
    if (0 < (int)aMbedtlsError) {
      local_4e0 = (undefined1  [8])local_4d0;
      local_518 = paVar1;
      local_510 = __return_storage_ptr__;
      local_504 = aMbedtlsError;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"dtls","");
      local_498 = (undefined1  [8])0x10000000e;
      local_490._M_p._0_4_ = 0xd;
      pcVar8 = "session(={}) successfully read data: len={}, {}";
      local_488 = "session(={}) successfully read data: len={}, {}";
      local_480._0_8_ = 0x2f;
      local_480._8_8_ = 0x300000000;
      local_468 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      pcStack_460 = ::fmt::v10::detail::
                    parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
      local_458 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_4b8._0_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)local_498;
      local_480._16_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)local_498;
      do {
        if (pcVar8 == "") break;
        pcVar7 = pcVar8;
        if (*pcVar8 == '{') {
LAB_00186222:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_4b8,pcVar8,pcVar7);
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,int,std::__cxx11::string>&>
                             (pcVar7,"",
                              (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                               *)local_498);
          bVar9 = true;
        }
        else {
          pcVar7 = pcVar8 + 1;
          bVar9 = pcVar7 != "";
          if (bVar9) {
            if (*pcVar7 != '{') {
              pcVar3 = pcVar8 + 2;
              do {
                pcVar7 = pcVar3;
                bVar9 = pcVar7 != "";
                if (pcVar7 == "") goto LAB_0018621e;
                pcVar3 = pcVar7 + 1;
              } while (*pcVar7 != '{');
            }
            bVar9 = true;
          }
LAB_0018621e:
          if (bVar9) goto LAB_00186222;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_4b8,pcVar8,"");
          bVar9 = false;
        }
      } while (bVar9);
      puVar6 = (pointer)(ulong)local_504;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_450,local_438,
                 local_438 + (long)puVar6,&local_519);
      utils::Hex_abi_cxx11_((string *)local_4b8,(utils *)&local_450,aBytes);
      __return_storage_ptr__ = local_510;
      local_480._8_8_ = local_4b8._0_8_;
      local_480._16_8_ = local_4b8._8_8_;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_498;
      fmt.size_ = 0xd1e;
      fmt.data_ = (char *)0x2f;
      local_498 = (undefined1  [8])this;
      local_488 = puVar6;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_500,(v10 *)"session(={}) successfully read data: len={}, {}",fmt,
                 args);
      Log(kDebug,(string *)local_4e0,(string *)local_500);
      if ((DtlsSession *)local_500._0_8_ != (DtlsSession *)(local_500 + 0x10)) {
        operator_delete((void *)local_500._0_8_);
      }
      if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)local_4b8._0_8_ !=
          (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)(local_4b8 + 0x10)) {
        operator_delete((void *)local_4b8._0_8_);
      }
      if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        operator_delete(local_450._M_pi);
      }
      if (local_4e0 != (undefined1  [8])local_4d0) {
        operator_delete((void *)local_4e0);
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_498,local_438,
                 local_438 + (long)puVar6,(allocator_type *)local_4e0);
      if ((this->super_Endpoint).mReceiver.super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar5 = std::__throw_bad_function_call();
        if ((DtlsSession *)local_500._0_8_ != (DtlsSession *)(local_500 + 0x10)) {
          operator_delete((void *)local_500._0_8_);
        }
        pcVar2 = (this_00->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != local_518) {
          operator_delete(pcVar2);
        }
        _Unwind_Resume(uVar5);
      }
      (*(this->super_Endpoint).mReceiver._M_invoker)
                ((_Any_data *)&(this->super_Endpoint).mReceiver,&this->super_Endpoint,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_498);
      local_500._0_8_ = local_498;
      if (local_498 == (undefined1  [8])0x0) {
        return __return_storage_ptr__;
      }
      goto LAB_001864ca;
    }
    if (aMbedtlsError == 0xffff9880) {
      this->mState = kConnecting;
      return __return_storage_ptr__;
    }
    if (aMbedtlsError == 0) {
      local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
      pcVar8 = "underlying transport of the DTLS session was closed";
      local_490._M_p = "underlying transport of the DTLS session was closed";
      local_488 = (pointer)0x33;
      local_480._0_8_ = 0;
      local_480._16_8_ = (type *)0x0;
      local_518 = paVar1;
      local_4b8._0_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)local_498;
      local_480._8_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            *)local_498;
      do {
        if (pcVar8 == "") break;
        pcVar7 = pcVar8;
        if (*pcVar8 == '{') {
LAB_00186581:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_4b8,pcVar8,pcVar7);
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar7,"",(format_string_checker<char> *)local_498);
          bVar9 = true;
        }
        else {
          pcVar7 = pcVar8 + 1;
          bVar9 = pcVar7 != "";
          if (bVar9) {
            if (*pcVar7 != '{') {
              pcVar3 = pcVar8 + 2;
              do {
                pcVar7 = pcVar3;
                bVar9 = pcVar7 != "";
                if (pcVar7 == "") goto LAB_0018657d;
                pcVar3 = pcVar7 + 1;
              } while (*pcVar7 != '{');
            }
            bVar9 = true;
          }
LAB_0018657d:
          if (bVar9) goto LAB_00186581;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)local_4b8,pcVar8,"");
          bVar9 = false;
        }
      } while (bVar9);
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_498;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_500,(v10 *)"underlying transport of the DTLS session was closed",
                 (string_view)ZEXT816(0x33),args_01);
      local_4e0._0_4_ = 0xb;
      local_4d8 = local_4c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d8,local_500._0_8_,(pointer)(local_500._0_8_ + local_500._8_8_));
      goto LAB_0018649a;
    }
    ErrorFromMbedtlsError((Error *)local_498,aMbedtlsError);
    __return_storage_ptr__->mCode = local_498._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_490);
    pDVar4 = (DtlsSession *)local_480;
    local_500._0_8_ = local_490._M_p;
  }
  else {
    local_498 = (undefined1  [8])((ulong)local_498 & 0xffffffff00000000);
    pcVar8 = "the DTLS session is not connected";
    local_490._M_p = "the DTLS session is not connected";
    local_488 = (pointer)0x21;
    local_480._0_8_ = 0;
    local_480._16_8_ = (type *)0x0;
    local_518 = paVar1;
    local_510 = __return_storage_ptr__;
    local_4b8._0_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)local_498;
    local_480._8_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)local_498;
    do {
      if (pcVar8 == "") break;
      pcVar7 = pcVar8;
      if (*pcVar8 == '{') {
LAB_00186410:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_4b8,pcVar8,pcVar7);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar7,"",(format_string_checker<char> *)local_498);
        bVar9 = true;
      }
      else {
        pcVar7 = pcVar8 + 1;
        bVar9 = pcVar7 != "";
        if (bVar9) {
          if (*pcVar7 != '{') {
            pcVar3 = pcVar8 + 2;
            do {
              pcVar7 = pcVar3;
              bVar9 = pcVar7 != "";
              if (pcVar7 == "") goto LAB_0018640c;
              pcVar3 = pcVar7 + 1;
            } while (*pcVar7 != '{');
          }
          bVar9 = true;
        }
LAB_0018640c:
        if (bVar9) goto LAB_00186410;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)local_4b8,pcVar8,"");
        bVar9 = false;
      }
    } while (bVar9);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_498;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_500,(v10 *)"the DTLS session is not connected",
               (string_view)ZEXT816(0x21),args_00);
    local_4e0._0_4_ = 0xf;
    local_4d8 = local_4c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d8,local_500._0_8_,(pointer)(local_500._0_8_ + local_500._8_8_));
    __return_storage_ptr__ = local_510;
LAB_0018649a:
    __return_storage_ptr__->mCode = local_4e0._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_4d8);
    if (local_4d8 != local_4c8) {
      operator_delete(local_4d8);
    }
    pDVar4 = (DtlsSession *)(local_500 + 0x10);
  }
  if ((DtlsSession *)local_500._0_8_ == pDVar4) {
    return __return_storage_ptr__;
  }
LAB_001864ca:
  operator_delete((void *)local_500._0_8_);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Read()
{
    int   rval = 0;
    Error error;

    uint8_t buf[kMaxContentLength];

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    rval = mbedtls_ssl_read(&mSsl, buf, sizeof(buf));

    if (rval > 0)
    {
        LOG_DEBUG(LOG_REGION_DTLS, "session(={}) successfully read data: len={}, {}", static_cast<void *>(this), rval,
                  utils::Hex({buf, buf + rval}));
        mReceiver(*this, {buf, buf + static_cast<size_t>(rval)});
        ExitNow();
    }

    switch (rval)
    {
    case 0:
        // \c 0 if the read end of the underlying transport was closed
        // - in this case you must stop using the context (see below)
        error = ERROR_IO_ERROR("underlying transport of the DTLS session was closed");
        break;

    case MBEDTLS_ERR_SSL_CLIENT_RECONNECT:
        // Continue reconnection
        mState = State::kConnecting;
        break;

    default:
        error = ErrorFromMbedtlsError(rval);
        break;
    }

exit:
    return error;
}